

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retLvalue.c
# Opt level: O0

int Abc_NtkRetimeLValue(Abc_Ntk_t *pNtk,int nIterLimit,int fVerbose)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  int nLatches;
  Vec_Int_t *vLags;
  int fVerbose_local;
  int nIterLimit_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkLatchNum(pNtk);
  iVar2 = Abc_NtkIsLogic(pNtk);
  if (iVar2 != 0) {
    p = Abc_NtkRetimeGetLags(pNtk,nIterLimit,fVerbose);
    Vec_IntFree(p);
    iVar2 = Abc_NtkCheck(pNtk);
    if (iVar2 == 0) {
      fprintf(_stdout,"Abc_NtkRetimeLValue(): Network check has failed.\n");
    }
    iVar2 = Abc_NtkLatchNum(pNtk);
    return iVar1 - iVar2;
  }
  __assert_fail("Abc_NtkIsLogic( pNtk )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retLvalue.c"
                ,0x41,"int Abc_NtkRetimeLValue(Abc_Ntk_t *, int, int)");
}

Assistant:

int Abc_NtkRetimeLValue( Abc_Ntk_t * pNtk, int nIterLimit, int fVerbose )
{
    Vec_Int_t * vLags;
    int nLatches = Abc_NtkLatchNum(pNtk);
    assert( Abc_NtkIsLogic( pNtk ) );
    // get the lags
    vLags = Abc_NtkRetimeGetLags( pNtk, nIterLimit, fVerbose );
    // compute the retiming
//    Abc_NtkRetimeUsingLags( pNtk, vLags, fVerbose );
    Vec_IntFree( vLags );
    // fix the COs
//    Abc_NtkLogicMakeSimpleCos( pNtk, 0 );
    // check for correctness
    if ( !Abc_NtkCheck( pNtk ) )
        fprintf( stdout, "Abc_NtkRetimeLValue(): Network check has failed.\n" );
    // return the number of latches saved
    return nLatches - Abc_NtkLatchNum(pNtk);
}